

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

ZSTD_DDict *
ZSTD_initStaticDDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType)

{
  size_t sVar1;
  ulong uVar2;
  void *__dest;
  
  if (((ulong)workspace & 7) == 0) {
    uVar2 = dictSize + 0x7060;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      uVar2 = 0x7060;
    }
    if (uVar2 <= workspaceSize) {
      __dest = dict;
      if (dictLoadMethod == ZSTD_dlm_byCopy) {
        __dest = (void *)((long)workspace + 0x7060);
        memcpy(__dest,dict,dictSize);
      }
      sVar1 = ZSTD_initDDict_internal
                        ((ZSTD_DDict *)workspace,__dest,dictSize,ZSTD_dlm_byRef,dictContentType);
      if (0xffffffffffffff88 < sVar1) {
        return (ZSTD_DDict *)0x0;
      }
      return (ZSTD_DDict *)workspace;
    }
  }
  return (ZSTD_DDict *)0x0;
}

Assistant:

const ZSTD_DDict* ZSTD_initStaticDDict(
                                void* workspace, size_t workspaceSize,
                                const void* dict, size_t dictSize,
                                ZSTD_dictLoadMethod_e dictLoadMethod,
                                ZSTD_dictContentType_e dictContentType)
{
    size_t const neededSpace =
            sizeof(ZSTD_DDict) + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
    ZSTD_DDict* const ddict = (ZSTD_DDict*)workspace;
    assert(workspace != NULL);
    assert(dict != NULL);
    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    if (workspaceSize < neededSpace) return NULL;
    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(ddict+1, dict, dictSize);  /* local copy */
        dict = ddict+1;
    }
    if (ZSTD_isError( ZSTD_initDDict_internal(ddict, dict, dictSize, ZSTD_dlm_byRef, dictContentType) ))
        return NULL;
    return ddict;
}